

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::SerReadWriteMany<DataStream,int&,long&>
               (DataStream *s,int *args,long *args_1)

{
  long lVar1;
  int *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  long *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<DataStream,int&,long&>(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }